

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib.c
# Opt level: O0

void zlib_compress_block(ssh_compressor *sc,uchar *block,int len,uchar **outblock,int *outlen,
                        int minlen)

{
  ssh_compression_alg *out_00;
  strbuf *psVar1;
  uchar *puVar2;
  _Bool in_block;
  Outbuf *out;
  ssh_zlib_compressor *comp;
  int minlen_local;
  int *outlen_local;
  uchar **outblock_local;
  int len_local;
  uchar *block_local;
  ssh_compressor *sc_local;
  
  out_00 = sc[-3].vt;
  if ((strbuf *)out_00->name == (strbuf *)0x0) {
    psVar1 = strbuf_new_nm();
    out_00->name = (char *)psVar1;
    if (((ulong)out_00->compress_new & 0x100000000) != 0) {
      outbits((Outbuf *)out_00,0x9c78,0x10);
      *(_Bool *)((long)&out_00->compress_new + 4) = false;
      outbits((Outbuf *)out_00,2,3);
    }
    lz77_compress((LZ77Context *)(sc + -4),block,len);
    outbits((Outbuf *)out_00,0,7);
    outbits((Outbuf *)out_00,2,10);
    outbits((Outbuf *)out_00,2,3);
    while (((strbuf *)out_00->name)->len < (ulong)(long)minlen) {
      outbits((Outbuf *)out_00,0,7);
      outbits((Outbuf *)out_00,2,3);
    }
    *outlen = (int)((strbuf *)out_00->name)->len;
    puVar2 = (uchar *)strbuf_to_str((strbuf *)out_00->name);
    *outblock = puVar2;
    out_00->name = (char *)0x0;
    return;
  }
  __assert_fail("!out->outbuf",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/zlib.c",0x269
                ,
                "void zlib_compress_block(ssh_compressor *, const unsigned char *, int, unsigned char **, int *, int)"
               );
}

Assistant:

void zlib_compress_block(ssh_compressor *sc,
                         const unsigned char *block, int len,
                         unsigned char **outblock, int *outlen,
                         int minlen)
{
    struct ssh_zlib_compressor *comp =
        container_of(sc, struct ssh_zlib_compressor, sc);
    struct Outbuf *out = (struct Outbuf *) comp->ectx.userdata;
    bool in_block;

    assert(!out->outbuf);
    out->outbuf = strbuf_new_nm();

    /*
     * If this is the first block, output the Zlib (RFC1950) header
     * bytes 78 9C. (Deflate compression, 32K window size, default
     * algorithm.)
     */
    if (out->firstblock) {
        outbits(out, 0x9C78, 16);
        out->firstblock = false;

        in_block = false;
    } else
        in_block = true;

    if (!in_block) {
        /*
         * Start a Deflate (RFC1951) fixed-trees block. We
         * transmit a zero bit (BFINAL=0), followed by a zero
         * bit and a one bit (BTYPE=01). Of course these are in
         * the wrong order (01 0).
         */
        outbits(out, 2, 3);
    }

    /*
     * Do the compression.
     */
    lz77_compress(&comp->ectx, block, len);

    /*
     * End the block (by transmitting code 256, which is
     * 0000000 in fixed-tree mode), and transmit some empty
     * blocks to ensure we have emitted the byte containing the
     * last piece of genuine data. There are three ways we can
     * do this:
     *
     *  - Minimal flush. Output end-of-block and then open a
     *    new static block. This takes 9 bits, which is
     *    guaranteed to flush out the last genuine code in the
     *    closed block; but allegedly zlib can't handle it.
     *
     *  - Zlib partial flush. Output EOB, open and close an
     *    empty static block, and _then_ open the new block.
     *    This is the best zlib can handle.
     *
     *  - Zlib sync flush. Output EOB, then an empty
     *    _uncompressed_ block (000, then sync to byte
     *    boundary, then send bytes 00 00 FF FF). Then open the
     *    new block.
     *
     * For the moment, we will use Zlib partial flush.
     */
    outbits(out, 0, 7);        /* close block */
    outbits(out, 2, 3 + 7);    /* empty static block */
    outbits(out, 2, 3);        /* open new block */

    /*
     * If we've been asked to pad out the compressed data until it's
     * at least a given length, do so by emitting further empty static
     * blocks.
     */
    while (out->outbuf->len < minlen) {
        outbits(out, 0, 7);            /* close block */
        outbits(out, 2, 3);            /* open new static block */
    }

    *outlen = out->outbuf->len;
    *outblock = (unsigned char *)strbuf_to_str(out->outbuf);
    out->outbuf = NULL;
}